

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGetTextureSubImageTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::GetTextureSubImage::Functional::check(Functional *this,GLenum target,bool is_compressed)

{
  ulong uVar1;
  ostringstream *this_00;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  void *pvVar4;
  undefined4 *puVar5;
  byte bVar6;
  byte bVar7;
  long lVar8;
  bool bVar9;
  uint uVar10;
  undefined7 in_register_00000011;
  int iVar11;
  int iVar12;
  char *pcVar13;
  int iVar14;
  GLint GVar15;
  GLubyte *pGVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  bool bVar21;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  bVar21 = target != 0xde0;
  iVar3 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  uVar1 = (ulong)bVar21 * 3 + 1;
  uVar17 = (uint)bVar21 << 2;
  bVar9 = target == 0x8c1a || target == 0x806f;
  GVar15 = (uint)bVar9 << 2;
  iVar2 = (uint)bVar9 + (uint)bVar9 * 2 + 1;
  if (target == 0x9009 || target == 0x8513) {
    GVar15 = 3;
    iVar2 = 3;
  }
  iVar12 = (int)CONCAT71(in_register_00000011,is_compressed);
  iVar11 = (uint)bVar21 * 0xc + 4;
  if (iVar12 != 0) {
    iVar11 = (int)(uVar1 >> 2);
  }
  bVar6 = is_compressed + 2;
  uVar18 = iVar11 * iVar2 << (bVar6 & 0x1f);
  pvVar4 = operator_new__((ulong)uVar18);
  uVar19 = (uint)uVar1;
  if (iVar12 == 0) {
    (*this->m_gl_GetTextureSubImage)
              (this->m_texture,0,4,uVar17,GVar15,4,uVar19,iVar2,0x1908,0x1401,uVar18,pvVar4);
  }
  else {
    (*this->m_gl_GetCompressedTextureSubImage)
              (this->m_texture,0,4,uVar17,GVar15,4,uVar19,iVar2,uVar18,pvVar4);
  }
  iVar3 = (**(code **)(CONCAT44(extraout_var,iVar3) + 0x800))();
  if (iVar3 != 0) {
    operator_delete__(pvVar4);
    puVar5 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar5 = 0;
    __cxa_throw(puVar5,&int::typeinfo,0);
  }
  bVar7 = is_compressed * '\x02';
  uVar19 = uVar19 >> (bVar7 & 0x1f);
  iVar11 = iVar12 * 3 + 1;
  iVar12 = (uint)!is_compressed + (uint)!is_compressed * 2 + 1;
  bVar9 = true;
  iVar3 = 0;
  do {
    if (uVar19 != 0) {
      uVar18 = 0;
      do {
        iVar14 = 0;
        do {
          uVar20 = iVar14 + iVar12 + ((uVar18 + (uVar17 >> (bVar7 & 0x1f))) * 8 >> (bVar7 & 0x1f)) +
                   (int)(((uint)((GVar15 + iVar3) * 8) >> (bVar7 & 0x1f)) << 3) / iVar11 <<
                   (bVar6 & 0x1f);
          uVar10 = iVar14 + (uVar18 * 4 >> (bVar7 & 0x1f)) +
                   (int)(((uint)(iVar3 * 4) >> (bVar7 & 0x1f)) << (target != 0xde0) * '\x02') /
                   iVar11 << (bVar6 & 0x1f);
          lVar8 = (ulong)is_compressed * 4 + 4;
          do {
            pGVar16 = "";
            if (is_compressed) {
              pGVar16 = s_texture_data_compressed;
            }
            if (pGVar16[uVar20] != *(GLubyte *)((long)pvVar4 + (ulong)uVar10)) {
              bVar9 = false;
              break;
            }
            uVar10 = uVar10 + 1;
            uVar20 = uVar20 + 1;
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
          iVar14 = iVar14 + 1;
        } while (iVar14 != iVar12);
        uVar18 = uVar18 + 1;
      } while (uVar18 != uVar19);
    }
    iVar3 = iVar3 + 1;
    if (iVar3 == iVar2) {
      operator_delete__(pvVar4);
      if (!bVar9) {
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        this_00 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"Functional test of ",0x13);
        pcVar13 = "glGetTextureSubImage ";
        if (is_compressed) {
          pcVar13 = "glGetCompressedTextureSubImage ";
        }
        lVar8 = 0x15;
        if (is_compressed) {
          lVar8 = 0x1f;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar13,lVar8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"function has failed with target ",0x20);
        local_1c0.m_getName = glu::getTextureTargetName;
        local_1c0.m_value = target;
        tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,".",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_138);
      }
      return bVar9;
    }
  } while( true );
}

Assistant:

bool gl4cts::GetTextureSubImage::Functional::check(glw::GLenum target, bool is_compressed)
{
	/* OpenGL functions access point. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Arguments setup (depends on dimmension) */
	glw::GLint x_offset = s_texture_data_width / 2 /* half */;
	glw::GLint width	= s_texture_data_width / 2 /* half */;

	glw::GLint y_offset = 0;
	glw::GLint height   = 1;

	glw::GLint z_offset = 0;
	glw::GLint depth	= 1;

	/* For 2 and 3 -dimensional textures setup y-direction. */
	if (GL_TEXTURE_1D != target)
	{
		y_offset = s_texture_data_height / 2 /* half */;
		height   = s_texture_data_height / 2 /* half */;
	}

	/* For 3-dimensional textures setup z-direction. */
	if ((GL_TEXTURE_3D == target) || (GL_TEXTURE_2D_ARRAY == target))
	{
		z_offset = s_texture_data_depth / 2 /* half */;
		depth	= s_texture_data_depth / 2 /* half */;
	}

	/* For cube-map texture stup 6-cube faces. */
	if ((GL_TEXTURE_CUBE_MAP == target) || (GL_TEXTURE_CUBE_MAP_ARRAY == target))
	{
		z_offset = 3; /* half of cube map */
		depth	= 3; /* half of cube map */
	}

	/* Setup number of components. */
	glw::GLint number_of_components = 0;

	if (is_compressed)
	{
		number_of_components = 8; /* 64 bit block of 4x4 compressed pixels. */
	}
	else
	{
		number_of_components = 4; /* RGBA components. */
	}

	/* Setup size. */
	glw::GLsizei size = 0;

	/* Iterate over pixels. */
	glw::GLint x_block = 1;
	glw::GLint y_block = 1;

	if (is_compressed)
	{
		/* Iterate over 4x4 compressed pixel block. */
		x_block = 4;
		y_block = 4;

		size = static_cast<glw::GLsizei>((width / x_block) * (height / y_block) * depth * number_of_components *
										 sizeof(glw::GLubyte));
	}
	else
	{
		size = static_cast<glw::GLsizei>(width * height * depth * number_of_components * sizeof(glw::GLubyte));
	}

	/* Storage for fetched texturte. */
	glw::GLubyte* texture_data = new glw::GLubyte[size];

	if (DE_NULL == texture_data)
	{
		throw 0;
	}

	/* Fetching texture. */
	if (is_compressed)
	{
		m_gl_GetCompressedTextureSubImage(m_texture, 0, x_offset, y_offset, z_offset, width, height, depth, size,
										  texture_data);
	}
	else
	{
		m_gl_GetTextureSubImage(m_texture, 0, x_offset, y_offset, z_offset, width, height, depth, GL_RGBA,
								GL_UNSIGNED_BYTE, size, texture_data);
	}

	/* Comprae fetched texture with reference. */
	glw::GLint error = gl.getError();

	bool is_ok = true;

	if (GL_NO_ERROR == error)
	{
		for (glw::GLint k = 0; k < depth; ++k)
		{
			for (glw::GLint j = 0; j < height / y_block; ++j)
			{
				for (glw::GLint i = 0; i < width / x_block; ++i)
				{
					for (glw::GLint c = 0; c < number_of_components; ++c) /* RGBA components iterating */
					{
						glw::GLuint reference_data_position =
							(i + (x_offset / x_block)) * number_of_components +
							(j + (y_offset / y_block)) * s_texture_data_width / x_block * number_of_components +
							(k + z_offset) * s_texture_data_width / x_block * s_texture_data_height / y_block *
								number_of_components +
							c;

						glw::GLuint tested_data_position =
							i * number_of_components + j * width / x_block * number_of_components +
							k * width / x_block * height / y_block * number_of_components + c;

						glw::GLubyte reference_value = (is_compressed) ?
														   s_texture_data_compressed[reference_data_position] :
														   s_texture_data[reference_data_position];
						glw::GLubyte tested_value = texture_data[tested_data_position];

						if (reference_value != tested_value)
						{
							is_ok = false;
							break;
						}
					}
				}
			}
		}
	}
	else
	{
		/* GL error. */
		delete[] texture_data;
		throw 0;
	}

	/* Cleanup. */
	delete[] texture_data;

	/* Error reporting. */
	if (!is_ok)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Functional test of "
						   << ((is_compressed) ? "glGetCompressedTextureSubImage " : "glGetTextureSubImage ")
						   << "function has failed with target " << glu::getTextureTargetStr(target) << "."
						   << tcu::TestLog::EndMessage;
	}

	/* Return result. */
	return is_ok;
}